

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Writer.cpp
# Opt level: O1

void __thiscall Writer::functionDefinitions(Writer *this,Program *program)

{
  DenseMapPair<const_llvm::Function_*,_std::unique_ptr<Func,_std::default_delete<Func>_>_> *pDVar1;
  Func *func_00;
  pointer ppVVar2;
  Block *block;
  long lVar3;
  iterator iVar4;
  bool bVar5;
  int iVar6;
  ulong uVar7;
  Func **ppFVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  _Base_ptr p_Var9;
  ulong uVar10;
  DenseMapPair<const_llvm::Function_*,_std::unique_ptr<Func,_std::default_delete<Func>_>_> *pDVar11;
  pointer ppVVar12;
  __normal_iterator<const_Func_**,_std::vector<const_Func_*,_std::allocator<const_Func_*>_>_> __i;
  long lVar13;
  Func **ppFVar14;
  DenseMapPair<const_llvm::Function_*,_std::unique_ptr<Func,_std::default_delete<Func>_>_> *pair;
  DenseMapPair<const_llvm::Function_*,_std::unique_ptr<Func,_std::default_delete<Func>_>_> *pDVar15;
  vector<const_Func_*,_std::allocator<const_Func_*>_> functions;
  Func *func;
  Func **local_98;
  iterator iStack_90;
  Func **local_88;
  undefined1 local_80 [32];
  Func **local_60;
  Func **local_58;
  string local_50;
  
  local_98 = (Func **)0x0;
  iStack_90._M_current = (Func **)0x0;
  local_88 = (Func **)0x0;
  pDVar11 = (program->functions).Buckets;
  uVar10 = (ulong)(program->functions).NumBuckets;
  uVar7 = uVar10 * 0x10;
  pDVar1 = pDVar11 + uVar10;
  pDVar15 = pDVar1;
  if ((program->functions).NumEntries != 0) {
    while ((pDVar15 = pDVar11, uVar10 != 0 &&
           (((ulong)(pDVar15->
                    super_pair<const_llvm::Function_*,_std::unique_ptr<Func,_std::default_delete<Func>_>_>
                    ).first | 0x1000) == 0xfffffffffffff000))) {
      uVar7 = uVar7 - 0x10;
      pDVar11 = pDVar15 + 1;
      uVar10 = uVar7;
    }
  }
  pDVar11 = (program->functions).Buckets + (program->functions).NumBuckets;
  if (pDVar15 != pDVar11) {
    do {
      local_80._0_8_ =
           (pDVar15->
           super_pair<const_llvm::Function_*,_std::unique_ptr<Func,_std::default_delete<Func>_>_>).
           second._M_t.super___uniq_ptr_impl<Func,_std::default_delete<Func>_>._M_t.
           super__Tuple_impl<0UL,_Func_*,_std::default_delete<Func>_>.
           super__Head_base<0UL,_Func_*,_false>._M_head_impl;
      if ((((Func *)local_80._0_8_)->isDeclaration == false) &&
         (bVar5 = isFunctionPrinted(this,(Func *)local_80._0_8_), bVar5)) {
        if (iStack_90._M_current == local_88) {
          std::vector<Func_const*,std::allocator<Func_const*>>::_M_realloc_insert<Func_const*const&>
                    ((vector<Func_const*,std::allocator<Func_const*>> *)&local_98,iStack_90,
                     (Func **)local_80);
        }
        else {
          *iStack_90._M_current = (Func *)local_80._0_8_;
          iStack_90._M_current = iStack_90._M_current + 1;
        }
      }
      do {
        pDVar15 = pDVar15 + 1;
        if (pDVar15 == pDVar1) break;
      } while (((ulong)(pDVar15->
                       super_pair<const_llvm::Function_*,_std::unique_ptr<Func,_std::default_delete<Func>_>_>
                       ).first | 0x1000) == 0xfffffffffffff000);
    } while (pDVar15 != pDVar11);
  }
  iVar4._M_current = iStack_90._M_current;
  ppFVar8 = local_98;
  if (local_98 != iStack_90._M_current) {
    lVar13 = (long)iStack_90._M_current - (long)local_98;
    uVar7 = lVar13 >> 3;
    lVar3 = 0x3f;
    if (uVar7 != 0) {
      for (; uVar7 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<Func_const**,std::vector<Func_const*,std::allocator<Func_const*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Writer::functionDefinitions(Program_const&)::__0>>
              (local_98,iStack_90._M_current,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar13 < 0x81) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<Func_const**,std::vector<Func_const*,std::allocator<Func_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<Writer::functionDefinitions(Program_const&)::__0>>
                (ppFVar8,iVar4._M_current);
    }
    else {
      ppFVar14 = ppFVar8 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<Func_const**,std::vector<Func_const*,std::allocator<Func_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<Writer::functionDefinitions(Program_const&)::__0>>
                (ppFVar8,ppFVar14);
      for (; ppFVar14 != iVar4._M_current; ppFVar14 = ppFVar14 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<Func_const**,std::vector<Func_const*,std::allocator<Func_const*>>>,__gnu_cxx::__ops::_Val_comp_iter<Writer::functionDefinitions(Program_const&)::__0>>
                  (ppFVar14);
      }
    }
  }
  local_60 = iStack_90._M_current;
  if (local_98 != iStack_90._M_current) {
    ppFVar8 = local_98;
    do {
      func_00 = *ppFVar8;
      local_58 = ppFVar8;
      functionHead(this,func_00,false);
      CWriter::startFunctionBody(&this->wr);
      ppVVar2 = (func_00->variables).super__Vector_base<Value_*,_std::allocator<Value_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      for (ppVVar12 = (func_00->variables).super__Vector_base<Value_*,_std::allocator<Value_*>_>.
                      _M_impl.super__Vector_impl_data._M_start; ppVVar12 != ppVVar2;
          ppVVar12 = ppVVar12 + 1) {
        CWriter::indent(&this->wr,1);
        iVar6 = (*((*ppVVar12)->super_ExprBase).super_Expr._vptr_Expr[4])();
        (**(code **)(*(long *)CONCAT44(extraout_var,iVar6) + 0x18))
                  ((StrRef)local_80,(long *)CONCAT44(extraout_var,iVar6));
        iVar6 = (*((*ppVVar12)->super_ExprBase).super_Expr._vptr_Expr[4])();
        (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar6) + 0x20))
                  (&local_50,(long *)CONCAT44(extraout_var_00,iVar6),&(*ppVVar12)->valueName);
        CWriter::declareVar(&this->wr,(StrRef)local_80,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if ((Func *)local_80._0_8_ != (Func *)(local_80 + 0x10)) {
          operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
        }
      }
      writeBlock(this,func_00->entry);
      for (p_Var9 = (func_00->blockMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var9 != &(func_00->blockMap)._M_t._M_impl.super__Rb_tree_header;
          p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9)) {
        block = (Block *)p_Var9[1]._M_parent;
        if ((block != func_00->entry) && (block->doInline == false)) {
          writeBlock(this,block);
        }
      }
      CWriter::endFunctionBody(&this->wr);
      local_80._0_8_ = local_80 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"");
      CWriter::line(&this->wr,(StrRef)local_80);
      if ((Func *)local_80._0_8_ != (Func *)(local_80 + 0x10)) {
        operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
      }
      ppFVar8 = local_58 + 1;
    } while (ppFVar8 != local_60);
  }
  if (local_98 != (Func **)0x0) {
    operator_delete(local_98,(long)local_88 - (long)local_98);
  }
  return;
}

Assistant:

void Writer::functionDefinitions(const Program& program) {
    std::vector<const Func*> functions;

    for (const auto& pair : program.functions) {
        const auto* func = pair.second.get();
        if (func->isDeclaration) {
            continue;
        }

        if (!isFunctionPrinted(func)) {
            continue;
        }

        functions.push_back(func);
    }

    std::sort(functions.begin(), functions.end(), [](const Func* a, const Func* b){ return a->name <= b->name;});

    for (const auto* func : functions) {

        functionHead(func);
        wr.startFunctionBody();

        // start with variables
        for (const auto& var : func->variables) {
            wr.indent(1);
            wr.declareVar(var->getType()->toString(), var->getType()->surroundName(var->valueName));
        }

        assert(func->entry);
        writeBlock(func->entry);

        for (const auto& blockEntry : func->blockMap) {
            const auto* block = blockEntry.second.get();

            if (block == func->entry)
                continue;

            if (!block->doInline) {
                writeBlock(block);
            }
        }

        wr.endFunctionBody();
        wr.line("");
    }
}